

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O0

maybe<unsigned_long,_void> *
anon_unknown.dwarf_17db49::get64
          (maybe<unsigned_long,_void> *__return_storage_ptr__,string *str,uint index)

{
  bool bVar1;
  char *pcVar2;
  uint *puVar3;
  unsigned_long *value;
  unsigned_long *extraout_RDX;
  undefined1 auVar4 [16];
  maybe<unsigned_int,_void> local_34;
  maybe<unsigned_int,_void> digit;
  int shift;
  uint64_t result;
  uint index_local;
  string *str_local;
  
  auVar4 = std::__cxx11::string::length();
  value = auVar4._8_8_;
  if (auVar4._0_8_ <= (ulong)index) {
    pstore::assert_failed
              ("index < str.length ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/uint128.cpp"
               ,0x26);
  }
  stack0xffffffffffffffd8 = 0;
  digit.valid_ = true;
  digit._1_3_ = 0;
  while( true ) {
    if ((int)digit._0_4_ < 0) {
      pstore::just<unsigned_long&>(__return_storage_ptr__,(pstore *)&digit.storage_.__align,value);
      return __return_storage_ptr__;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    hex_to_digit(&local_34,*pcVar2);
    bVar1 = pstore::maybe::operator_cast_to_bool((maybe *)&local_34);
    if (bVar1) {
      puVar3 = pstore::maybe<unsigned_int,_void>::value(&local_34);
      register0x00000000 = (ulong)*puVar3 << (digit.valid_ & 0x3fU) | stack0xffffffffffffffd8;
    }
    else {
      pstore::nothing<unsigned_long>();
    }
    pstore::maybe<unsigned_int,_void>::~maybe(&local_34);
    if (!bVar1) break;
    digit._0_4_ = digit._0_4_ + -4;
    value = extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<std::uint64_t> get64 (std::string const & str, unsigned index) {
        PSTORE_ASSERT (index < str.length ());
        auto result = std::uint64_t{0};
        for (auto shift = 60; shift >= 0; shift -= 4, ++index) {
            auto const digit = hex_to_digit (str[index]);
            if (!digit) {
                return nothing<std::uint64_t> ();
            }
            result |=
                (static_cast<std::uint64_t> (digit.value ()) << static_cast<unsigned> (shift));
        }
        return just (result);
    }